

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsObject.c
# Opt level: O0

JsObject *
JsCreateStandardSpecFunction
          (JsObject *o,JsList scope,int argc,char **argv,JsSpecFunctionFn fn,void *data,char *name,
          int sync)

{
  JsObject *pJVar1;
  int *piVar2;
  JsLock pvVar3;
  JsObject *pJVar4;
  JsValue *pJVar5;
  JsValue *length;
  JsValue *prototype;
  JsValue *constructor;
  JsObject *prototypeObj;
  JsFunction *function;
  JsObject *obj;
  void *data_local;
  JsSpecFunctionFn fn_local;
  char **argv_local;
  int argc_local;
  JsList scope_local;
  JsObject *o_local;
  
  pJVar1 = JsCreateBaseObject(o,1,2,scope);
  piVar2 = (int *)JsMalloc(0x38);
  *(int **)((long)*pJVar1->sb + 0x18) = piVar2;
  *piVar2 = argc;
  *(char ***)(piVar2 + 2) = argv;
  *(void **)(piVar2 + 4) = data;
  *(JsSpecFunctionFn *)(piVar2 + 6) = fn;
  *(char **)(piVar2 + 8) = name;
  piVar2[10] = sync;
  if (sync != 0) {
    pvVar3 = JsCreateLock();
    *(JsLock *)(piVar2 + 0xc) = pvVar3;
  }
  pJVar4 = JsCreateStandardObject((JsObject *)0x0);
  pJVar5 = (JsValue *)JsMalloc(0x18);
  pJVar5->type = JS_OBJECT;
  (pJVar5->u).object = pJVar1;
  (*pJVar4->Put)(pJVar4,"constructor",pJVar5,2);
  pJVar5 = (JsValue *)JsMalloc(0x18);
  pJVar5->type = JS_OBJECT;
  (pJVar5->u).object = pJVar4;
  (*pJVar1->Put)(pJVar1,"prototype",pJVar5,4);
  pJVar5 = (JsValue *)JsMalloc(0x18);
  pJVar5->type = JS_NUMBER;
  (pJVar5->u).number = (double)argc;
  (*pJVar1->Put)(pJVar1,"length",pJVar5,7);
  return pJVar1;
}

Assistant:

struct JsObject* JsCreateStandardSpecFunction(struct JsObject* o,JsList scope, int argc, 
		char** argv,JsSpecFunctionFn fn,void* data,char* name,int sync){
	
	struct JsObject* obj = JsCreateBaseObject(o,TRUE,2,scope);
	
	struct JsFunction* function = (struct JsFunction* )JsMalloc(sizeof(struct JsFunction));
	//添加到sb
	
	((struct JsStandardSelfBlock*)obj->sb[JS_STANDARD_OBJECT_FLOOR])->function = function;
		
	function->argc = argc; 
	function->argv = argv;
	function->data = data;
	function->fn = fn;
	function->name = name;
	function->sync = sync;
	if(sync){
		function->fSyncLock = JsCreateLock();
	}
	
	//配置prototype
	struct JsObject* prototypeObj = JsCreateStandardObject(NULL);
	struct JsValue* constructor = (struct JsValue*)JsMalloc(sizeof(struct JsValue));
	constructor->type = JS_OBJECT;
	constructor->u.object = obj;
	(*prototypeObj->Put)(prototypeObj,"constructor",constructor,JS_OBJECT_ATTR_DONTENUM);
	
	//配置Function Object显示属性
	struct JsValue* prototype = (struct JsValue*)JsMalloc(sizeof(struct JsValue));
	prototype->type = JS_OBJECT;
	prototype->u.object = prototypeObj;
	(*obj->Put)(obj,"prototype",prototype,JS_OBJECT_ATTR_DONTDELETE);
	
	struct JsValue* length = (struct JsValue*)JsMalloc(sizeof(struct JsValue));
	length->type = JS_NUMBER;
	length->u.number = argc;
	(*obj->Put)(obj,"length",length,JS_OBJECT_ATTR_STRICT);
	
	return obj;
}